

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadElemSection(BinaryReader *this,Offset section_size)

{
  int iVar1;
  Result RVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  ExternalKind EVar6;
  uint32_t flags;
  Opcode opcode;
  Index num_elem_exprs;
  Type elem_type;
  Index num_elem_segments;
  uint32_t value;
  uint local_6c;
  Opcode local_68;
  ExternalKind local_64;
  Type local_60;
  uint local_54;
  string local_50;
  
  iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8e])();
  if (iVar1 == 0) {
    RVar2 = ReadCount(this,&local_54,"elem segment count");
    if (RVar2.enum_ != Error) {
      iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8f])(this->delegate_,(ulong)local_54);
      if (iVar1 == 0) {
        if (local_54 != 0) {
          uVar5 = 0;
          do {
            RVar2 = ReadU32Leb128(this,&local_6c,"elem segment flags");
            if (RVar2.enum_ == Error) {
              return (Result)Error;
            }
            if (7 < local_6c) {
              PrintError(this,"invalid elem segment flags: %#x");
              return (Result)Error;
            }
            uVar4 = 0;
            if (((local_6c & 3) == 2) &&
               (RVar2 = ReadU32Leb128(this,(uint32_t *)&local_50,"elem segment table index"),
               uVar4 = (uint)local_50._M_dataplus._M_p, RVar2.enum_ == Error)) {
              return (Result)Error;
            }
            local_60.enum_ = FuncRef;
            local_60.type_index_ = 0xffffffff;
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x90])
                              (this->delegate_,uVar5,(ulong)uVar4);
            if (iVar1 != 0) {
              pcVar3 = "BeginElemSegment callback failed";
              goto LAB_00119ab3;
            }
            pcVar3 = extraout_RDX;
            if ((local_6c & 1) == 0) {
              iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x91])(this->delegate_,uVar5);
              if (iVar1 != 0) {
                pcVar3 = "BeginElemSegmentInitExpr callback failed";
                goto LAB_00119ab3;
              }
              RVar2 = ReadInstructions(this,true,this->read_end_,(Opcode *)0x0);
              if (RVar2.enum_ == Error) {
                return (Result)Error;
              }
              iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x92])(this->delegate_,uVar5);
              pcVar3 = extraout_RDX_00;
              if (iVar1 != 0) {
                pcVar3 = "EndElemSegmentInitExpr callback failed";
                goto LAB_00119ab3;
              }
            }
            if ((local_6c & 3) != 0) {
              if ((local_6c & 4) == 0) {
                RVar2 = ReadExternalKind(this,&local_64,pcVar3);
                if (RVar2.enum_ == Error) {
                  return (Result)Error;
                }
                if (local_64 != First) {
                  Type::GetName_abi_cxx11_(&local_50,&local_60);
                  PrintError(this,"segment elem type must be func (%s)",
                             CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                      (uint)local_50._M_dataplus._M_p));
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint)local_50._M_dataplus._M_p)
                      == &local_50.field_2) {
                    return (Result)Error;
                  }
                  operator_delete((undefined1 *)
                                  CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                           (uint)local_50._M_dataplus._M_p),
                                  local_50.field_2._M_allocated_capacity + 1);
                  return (Result)Error;
                }
                local_60.enum_ = FuncRef;
                local_60.type_index_ = 0xffffffff;
              }
              else {
                RVar2 = ReadRefType(this,&local_60,"table elem type");
                if (RVar2.enum_ == Error) {
                  return (Result)Error;
                }
              }
            }
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x93])
                              (this->delegate_,uVar5,local_60);
            if (iVar1 != 0) {
              pcVar3 = "OnElemSegmentElemType callback failed";
              goto LAB_00119ab3;
            }
            RVar2 = ReadCount(this,&local_64,"elem count");
            EVar6 = local_64;
            if (RVar2.enum_ == Error) {
              return (Result)Error;
            }
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x94])
                              (this->delegate_,uVar5,(ulong)local_64);
            if (iVar1 != 0) {
              pcVar3 = "OnElemSegmentElemExprCount callback failed";
              goto LAB_00119ab3;
            }
            for (; EVar6 != First; EVar6 = EVar6 - Table) {
              if ((local_6c & 4) == 0) {
                RVar2 = ReadU32Leb128(this,(uint32_t *)&local_50,"elem expr func index");
                if (RVar2.enum_ == Error) {
                  return (Result)Error;
                }
                iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x96])
                                  (this->delegate_,uVar5,(ulong)(uint)local_50._M_dataplus._M_p);
                if (iVar1 != 0) {
LAB_00119e34:
                  pcVar3 = "OnElemSegmentElemExpr_RefFunc callback failed";
                  goto LAB_00119ab3;
                }
              }
              else {
                RVar2 = ReadOpcode(this,&local_68,"elem expr opcode");
                if (RVar2.enum_ == Error) {
                  return (Result)Error;
                }
                if (local_68.enum_ == RefFunc) {
                  RVar2 = ReadU32Leb128(this,(uint32_t *)&local_50,"elem expr func index");
                  if (RVar2.enum_ == Error) {
                    return (Result)Error;
                  }
                  iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x96])
                                    (this->delegate_,uVar5,(ulong)(uint)local_50._M_dataplus._M_p);
                  if (iVar1 != 0) goto LAB_00119e34;
                }
                else if (local_68.enum_ == RefNull) {
                  RVar2 = ReadRefType(this,(Type *)&local_50,"elem expr ref.null type");
                  if (RVar2.enum_ == Error) {
                    return (Result)Error;
                  }
                  iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x95])
                                    (this->delegate_,uVar5,
                                     CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                              (uint)local_50._M_dataplus._M_p));
                  if (iVar1 != 0) {
                    pcVar3 = "OnElemSegmentElemExpr_RefNull callback failed";
                    goto LAB_00119ab3;
                  }
                }
                else {
                  PrintError(this,"expected ref.null or ref.func in passive element segment");
                }
                RVar2 = ReadOpcode(this,&local_68,"opcode");
                if (RVar2.enum_ == Error) {
                  return (Result)Error;
                }
                if (local_68.enum_ != End) {
                  pcVar3 = "expected END opcode after element expression";
                  goto LAB_00119ab3;
                }
              }
            }
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x97])(this->delegate_,uVar5);
            if (iVar1 != 0) {
              pcVar3 = "EndElemSegment callback failed";
              goto LAB_00119ab3;
            }
            uVar4 = (int)uVar5 + 1;
            uVar5 = (ulong)uVar4;
          } while (uVar4 != local_54);
        }
        iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x98])();
        if (iVar1 == 0) {
          return (Result)Ok;
        }
        pcVar3 = "EndElemSection callback failed";
      }
      else {
        pcVar3 = "OnElemSegmentCount callback failed";
      }
      PrintError(this,pcVar3);
    }
  }
  else {
    pcVar3 = "BeginElemSection callback failed";
LAB_00119ab3:
    PrintError(this,pcVar3);
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadElemSection(Offset section_size) {
  CALLBACK(BeginElemSection, section_size);
  Index num_elem_segments;
  CHECK_RESULT(ReadCount(&num_elem_segments, "elem segment count"));
  CALLBACK(OnElemSegmentCount, num_elem_segments);
  for (Index i = 0; i < num_elem_segments; ++i) {
    uint32_t flags;
    CHECK_RESULT(ReadU32Leb128(&flags, "elem segment flags"));
    ERROR_IF(flags > SegFlagMax, "invalid elem segment flags: %#x", flags);
    Index table_index(0);
    if ((flags & (SegPassive | SegExplicitIndex)) == SegExplicitIndex) {
      CHECK_RESULT(ReadIndex(&table_index, "elem segment table index"));
    }
    Type elem_type = Type::FuncRef;

    CALLBACK(BeginElemSegment, i, table_index, flags);

    if (!(flags & SegPassive)) {
      CALLBACK(BeginElemSegmentInitExpr, i);
      CHECK_RESULT(ReadInitExpr(i));
      CALLBACK(EndElemSegmentInitExpr, i);
    }

    // For backwards compat we support not declaring the element kind.
    if (flags & (SegPassive | SegExplicitIndex)) {
      if (flags & SegUseElemExprs) {
        CHECK_RESULT(ReadRefType(&elem_type, "table elem type"));
      } else {
        ExternalKind kind;
        CHECK_RESULT(ReadExternalKind(&kind, "export kind"));
        ERROR_UNLESS(kind == ExternalKind::Func,
                     "segment elem type must be func (%s)",
                     elem_type.GetName().c_str());
        elem_type = Type::FuncRef;
      }
    }

    CALLBACK(OnElemSegmentElemType, i, elem_type);

    Index num_elem_exprs;
    CHECK_RESULT(ReadCount(&num_elem_exprs, "elem count"));

    CALLBACK(OnElemSegmentElemExprCount, i, num_elem_exprs);
    for (Index j = 0; j < num_elem_exprs; ++j) {
      if (flags & SegUseElemExprs) {
        Opcode opcode;
        CHECK_RESULT(ReadOpcode(&opcode, "elem expr opcode"));
        if (opcode == Opcode::RefNull) {
          Type type;
          CHECK_RESULT(ReadRefType(&type, "elem expr ref.null type"));
          CALLBACK(OnElemSegmentElemExpr_RefNull, i, type);
        } else if (opcode == Opcode::RefFunc) {
          Index func_index;
          CHECK_RESULT(ReadIndex(&func_index, "elem expr func index"));
          CALLBACK(OnElemSegmentElemExpr_RefFunc, i, func_index);
        } else {
          PrintError(
              "expected ref.null or ref.func in passive element segment");
        }
        CHECK_RESULT(ReadOpcode(&opcode, "opcode"));
        ERROR_UNLESS(opcode == Opcode::End,
                     "expected END opcode after element expression");
      } else {
        Index func_index;
        CHECK_RESULT(ReadIndex(&func_index, "elem expr func index"));
        CALLBACK(OnElemSegmentElemExpr_RefFunc, i, func_index);
      }
    }
    CALLBACK(EndElemSegment, i);
  }
  CALLBACK0(EndElemSection);
  return Result::Ok;
}